

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::GetConstNull
          (ReplaceDescArrayAccessUsingVarIndex *this,uint32_t type_id)

{
  TypeManager *this_00;
  Type *type;
  ConstantManager *pCVar1;
  Constant *c;
  Instruction *pIVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (type_id != 0) {
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    type = analysis::TypeManager::GetType(this_00,type_id);
    pCVar1 = IRContext::get_constant_mgr((this->super_Pass).context_);
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c = analysis::ConstantManager::GetConstant
                  (pCVar1,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
    pCVar1 = IRContext::get_constant_mgr((this->super_Pass).context_);
    pIVar2 = analysis::ConstantManager::GetDefiningInstruction(pCVar1,c,0,(inst_iterator *)0x0);
    return pIVar2;
  }
  __assert_fail("type_id != 0 && \"Result type is expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                ,0x17a,
                "Instruction *spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::GetConstNull(uint32_t) const"
               );
}

Assistant:

Instruction* ReplaceDescArrayAccessUsingVarIndex::GetConstNull(
    uint32_t type_id) const {
  assert(type_id != 0 && "Result type is expected");
  auto* type = context()->get_type_mgr()->GetType(type_id);
  auto* null_const = context()->get_constant_mgr()->GetConstant(type, {});
  return context()->get_constant_mgr()->GetDefiningInstruction(null_const);
}